

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateMultiFunctionDescription
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  bool bVar1;
  RepeatedPtrField<CoreML::Specification::FunctionDescription> *this;
  string *__x;
  allocator<char> local_219;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  string *local_158;
  string *defaultFunctionName;
  reference local_148;
  FunctionDescription *function;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FunctionDescription> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  functionNames;
  RepeatedPtrField<CoreML::Specification::FunctionDescription> *functions;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  ValidationPolicy *validationPolicy_local;
  ModelDescription *pMStack_18;
  int modelVersion_local;
  ModelDescription *interface_local;
  Result *r;
  
  local_28 = (string *)validationPolicy;
  validationPolicy_local._4_4_ = modelVersion;
  pMStack_18 = interface;
  interface_local = (ModelDescription *)__return_storage_ptr__;
  if ((validationPolicy->allowsMultipleFunctions & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"This model type doesn\'t support multi-function syntax.",
               &local_49);
    Result::Result(__return_storage_ptr__,MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else if (modelVersion < 9) {
    std::__cxx11::to_string(&local_e0,9);
    std::operator+(&local_c0,"Multi-function syntax is only valid in specification verison >= ",
                   &local_e0);
    std::operator+(&local_a0,&local_c0,". This model has version ");
    std::__cxx11::to_string((string *)&functions,validationPolicy_local._4_4_);
    std::operator+(&local_80,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&functions);
    Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&functions);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    this = Specification::ModelDescription::functions(interface);
    __range1 = (RepeatedPtrField<CoreML::Specification::FunctionDescription> *)0x0;
    functionNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    functionNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
    __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::begin
                       (this);
    function = (FunctionDescription *)
               google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::end
                         (this);
    while( true ) {
      bVar1 = google::protobuf::internal::
              RepeatedPtrIterator<const_CoreML::Specification::FunctionDescription>::operator!=
                        (&__end1,(iterator *)&function);
      if (!bVar1) break;
      local_148 = google::protobuf::internal::
                  RepeatedPtrIterator<const_CoreML::Specification::FunctionDescription>::operator*
                            (&__end1);
      defaultFunctionName._7_1_ = 0;
      validationPolicy = (ValidationPolicy *)local_28;
      validateFeatureDescriptions<CoreML::Specification::FunctionDescription>
                (__return_storage_ptr__,local_148,validationPolicy_local._4_4_,
                 (ValidationPolicy *)local_28);
      bVar1 = Result::good(__return_storage_ptr__);
      if (bVar1) {
        __x = Specification::FunctionDescription::name_abi_cxx11_(local_148);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1,__x);
      }
      else {
        defaultFunctionName._7_1_ = 1;
      }
      defaultFunctionName._0_4_ = (uint)!bVar1;
      if ((defaultFunctionName._7_1_ & 1) == 0) {
        Result::~Result(__return_storage_ptr__);
      }
      if ((uint)defaultFunctionName != 0) goto LAB_004314b3;
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FunctionDescription>::operator++(&__end1);
    }
    local_158 = Specification::ModelDescription::defaultfunctionname_abi_cxx11_(pMStack_18);
    local_168._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1);
    local_170 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
    local_160 = std::
                find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                          (local_168,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_170,local_158);
    local_178._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1);
    bVar1 = __gnu_cxx::operator==(&local_160,&local_178);
    if (bVar1) {
      std::operator+(&local_1d8,"The default function name \'",local_158);
      std::operator+(&local_1b8,&local_1d8,"\' is not found in the function name list: ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,",",&local_219);
      componentsJoinedBy<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_1f8,(CoreML *)&__range1,&local_218,(string *)validationPolicy);
      std::operator+(&local_198,&local_1b8,&local_1f8);
      Result::Result(__return_storage_ptr__,INVALID_DEFAULT_FUNCTION_NAME,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      defaultFunctionName._0_4_ = 1;
    }
    else {
      Result::Result(__return_storage_ptr__);
      defaultFunctionName._0_4_ = 1;
    }
LAB_004314b3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateMultiFunctionDescription(const Specification::ModelDescription& interface, int modelVersion, const ValidationPolicy& validationPolicy) {
        if (!validationPolicy.allowsMultipleFunctions) {
            return  Result(ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION,
                           "This model type doesn't support multi-function syntax.");
        }

        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS18) {
            return  Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                           "Multi-function syntax is only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS18)+
                           ". This model has version " + std::to_string(modelVersion));
        }

        const auto& functions = interface.functions();
        auto functionNames = std::vector<std::string>();
        for (const auto& function: functions) {
            Result r = validateFeatureDescriptions(function, modelVersion, validationPolicy);
            if (!r.good()) {
                return r;
            }
            functionNames.push_back(function.name());
        }

        // The default function name must be in function name list.
        const auto& defaultFunctionName = interface.defaultfunctionname();
        if (find(functionNames.begin(), functionNames.end(), defaultFunctionName) == functionNames.end()) {
            return  Result(ResultType::INVALID_DEFAULT_FUNCTION_NAME,
                           "The default function name '" + defaultFunctionName + "' is not found in the function name list: " + componentsJoinedBy(functionNames, ","));
        }

        return Result();
    }